

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void unixShmPurge(unixFile *pFd)

{
  unixShmNode *p;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  p = pFd->pInode->pShmNode;
  if ((p != (unixShmNode *)0x0) && (p->nRef == 0)) {
    uVar1 = (*aSyscall[0x19].pCurrent)();
    uVar2 = 1;
    if (0x7fff < (int)uVar1) {
      uVar2 = uVar1 >> 0xf;
    }
    if (p->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexFree)(p->mutex);
    }
    if (p->nRegion != 0) {
      uVar3 = 0;
      do {
        if (p->h < 0) {
          sqlite3_free(p->apRegion[uVar3]);
        }
        else {
          (*aSyscall[0x17].pCurrent)(p->apRegion[uVar3],(long)p->szRegion);
        }
        uVar3 = uVar3 + uVar2;
      } while (uVar3 < p->nRegion);
    }
    sqlite3_free(p->apRegion);
    if (-1 < p->h) {
      robust_close(pFd,p->h,0x8737);
      p->h = -1;
    }
    p->pInode->pShmNode = (unixShmNode *)0x0;
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void unixShmPurge(unixFile *pFd){
  unixShmNode *p = pFd->pInode->pShmNode;
  assert( unixMutexHeld() );
  if( p && ALWAYS(p->nRef==0) ){
    int nShmPerMap = unixShmRegionPerMap();
    int i;
    assert( p->pInode==pFd->pInode );
    sqlite3_mutex_free(p->mutex);
    for(i=0; i<p->nRegion; i+=nShmPerMap){
      if( p->h>=0 ){
        osMunmap(p->apRegion[i], p->szRegion);
      }else{
        sqlite3_free(p->apRegion[i]);
      }
    }
    sqlite3_free(p->apRegion);
    if( p->h>=0 ){
      robust_close(pFd, p->h, __LINE__);
      p->h = -1;
    }
    p->pInode->pShmNode = 0;
    sqlite3_free(p);
  }
}